

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void Diffusion::setDomainBC
               (array<amrex::LinOpBCType,_3UL> *mlmg_lobc,array<amrex::LinOpBCType,_3UL> *mlmg_hibc,
               BCRec *bc)

{
  int iVar1;
  bool bVar2;
  Geometry *this;
  reference pvVar3;
  long in_RDX;
  int pbc;
  int idim;
  size_type in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int dir;
  
  for (dir = 0; dir < 3; dir = dir + 1) {
    this = amrex::DefaultGeometry();
    bVar2 = amrex::Geometry::isPeriodic(this,dir);
    if (bVar2) {
      pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *pvVar3 = Periodic;
      pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *pvVar3 = Periodic;
    }
    else {
      iVar1 = *(int *)(in_RDX + (long)dir * 4);
      if (iVar1 == 3) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,3),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = Dirichlet;
      }
      else if (((iVar1 == 2) || (iVar1 == 4)) || (iVar1 == 1)) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,iVar1),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = Neumann;
      }
      else if (iVar1 == -1) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,0xffffffff),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = reflect_odd;
      }
      else {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,iVar1),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = bogus;
      }
      in_stack_ffffffffffffffc0 = *(int *)(in_RDX + (long)(dir + 3) * 4);
      if (in_stack_ffffffffffffffc0 == 3) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,3),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = Dirichlet;
      }
      else if (((in_stack_ffffffffffffffc0 == 2) || (in_stack_ffffffffffffffc0 == 4)) ||
              (in_stack_ffffffffffffffc0 == 1)) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        *pvVar3 = Neumann;
      }
      else if (in_stack_ffffffffffffffc0 == -1) {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,0xffffffff),
                            in_stack_ffffffffffffffb8);
        *pvVar3 = reflect_odd;
      }
      else {
        pvVar3 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        *pvVar3 = bogus;
      }
    }
  }
  return;
}

Assistant:

void
Diffusion::setDomainBC (std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_lobc,
                            std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_hibc,
                            const BCRec& bc)
{

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
      // DefaultGeometry() is same as parent->Geom(0)
      if (DefaultGeometry().isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else
        {
            int pbc = bc.lo(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_lobc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_lobc[idim] = LinOpBCType::bogus;
            }

            pbc = bc.hi(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_hibc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_hibc[idim] = LinOpBCType::bogus;
            }
        }
    }
}